

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_beziers.cpp
# Opt level: O3

Bezier<2UL> * bezier::test::defaultQuadraticBezier(void)

{
  Bezier<2UL> *in_RDI;
  initializer_list<bezier::Vec2> __l;
  allocator_type local_61;
  vector<bezier::Vec2,_std::allocator<bezier::Vec2>_> local_60;
  Vec2 local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_48.x = 70.0;
  local_48.y = 155.0;
  local_38 = 0x4034000000000000;
  uStack_30 = 0x405b800000000000;
  local_28 = 0x4059000000000000;
  uStack_20 = 0x4052c00000000000;
  __l._M_len = 3;
  __l._M_array = &local_48;
  std::vector<bezier::Vec2,_std::allocator<bezier::Vec2>_>::vector(&local_60,__l,&local_61);
  Bezier<2UL>::Bezier(in_RDI,&local_60);
  if (local_60.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<bezier::Vec2,_std::allocator<bezier::Vec2>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

bezier::Bezier<2> bezier::test::defaultQuadraticBezier()
{
    return ::bezier::Bezier<2>({
        {70, 155},
        {20, 110},
        {100, 75}
    });
}